

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

Vec_Int_t * Vta_ManCollectNodes(Vta_Man_t *p,int f)

{
  int iObj;
  Gia_Obj_t *pObj;
  Vta_Obj_t *pThis;
  
  p->vOrder->nSize = 0;
  pObj = Gia_ManPo(p->pGia,f);
  iObj = Gia_ObjFaninId0p(p->pGia,pObj);
  pThis = Vga_ManFind(p,iObj,f);
  if (pThis == (Vta_Obj_t *)0x0) {
    __assert_fail("pThis != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x1ee,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
  }
  if (-1 < *(int *)&pThis->field_0xc) {
    Vta_ManCollectNodes_rec(p,pThis,p->vOrder);
    if (*(int *)&pThis->field_0xc < 0) {
      return p->vOrder;
    }
    __assert_fail("pThis->fVisit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x1f1,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
  }
  __assert_fail("!pThis->fVisit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                ,0x1ef,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
}

Assistant:

Vec_Int_t * Vta_ManCollectNodes( Vta_Man_t * p, int f )
{
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    Vec_IntClear( p->vOrder );
    pObj = Gia_ManPo( p->pGia, 0 );
    pThis = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), f );
    assert( pThis != NULL );
    assert( !pThis->fVisit );
    Vta_ManCollectNodes_rec( p, pThis, p->vOrder );
    assert( pThis->fVisit );
    return p->vOrder;
}